

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BOOL opj_jp2_default_validation
                   (opj_jp2_t *jp2,opj_stream_private_t *cio,opj_event_mgr_t *p_manager)

{
  uint uVar1;
  bool local_29;
  uint local_28;
  uint local_24;
  OPJ_UINT32 i;
  OPJ_BOOL l_is_valid;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *cio_local;
  opj_jp2_t *jp2_local;
  
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x8a1,
                  "OPJ_BOOL opj_jp2_default_validation(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (cio != (opj_stream_private_t *)0x0) {
    if (p_manager != (opj_event_mgr_t *)0x0) {
      local_24 = (uint)(jp2->w != 0 &&
                       (jp2->h != 0 &&
                       (jp2->numcl != 0 &&
                       (jp2->m_validation_list != (opj_procedure_list *)0x0 &&
                       (jp2->m_procedure_list != (opj_procedure_list *)0x0 &&
                       (jp2->j2k != (opj_j2k_t *)0x0 &&
                       (jp2->jp2_img_state == 0 && jp2->jp2_state == 0)))))));
      for (local_28 = 0; local_28 < jp2->numcomps; local_28 = local_28 + 1) {
        local_24 = (jp2->comps[local_28].bpcc & 0x7f) < 0x26 & local_24;
      }
      local_29 = false;
      if (jp2->meth != 0) {
        local_29 = jp2->meth < 3;
      }
      uVar1 = opj_stream_has_seek(cio);
      return uVar1 & local_29 & local_24;
    }
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x8a3,
                  "OPJ_BOOL opj_jp2_default_validation(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("cio != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x8a2,
                "OPJ_BOOL opj_jp2_default_validation(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_default_validation(opj_jp2_t * jp2,
        opj_stream_private_t *cio,
        opj_event_mgr_t * p_manager
                                          )
{
    OPJ_BOOL l_is_valid = OPJ_TRUE;
    OPJ_UINT32 i;

    /* preconditions */
    assert(jp2 != 00);
    assert(cio != 00);
    assert(p_manager != 00);

    OPJ_UNUSED(p_manager);

    /* JPEG2000 codec validation */

    /* STATE checking */
    /* make sure the state is at 0 */
    l_is_valid &= (jp2->jp2_state == JP2_STATE_NONE);

    /* make sure not reading a jp2h ???? WEIRD */
    l_is_valid &= (jp2->jp2_img_state == JP2_IMG_STATE_NONE);

    /* POINTER validation */
    /* make sure a j2k codec is present */
    l_is_valid &= (jp2->j2k != 00);

    /* make sure a procedure list is present */
    l_is_valid &= (jp2->m_procedure_list != 00);

    /* make sure a validation list is present */
    l_is_valid &= (jp2->m_validation_list != 00);

    /* PARAMETER VALIDATION */
    /* number of components */
    l_is_valid &= (jp2->numcl > 0);
    /* width */
    l_is_valid &= (jp2->h > 0);
    /* height */
    l_is_valid &= (jp2->w > 0);
    /* precision */
    for (i = 0; i < jp2->numcomps; ++i) {
        l_is_valid &= ((jp2->comps[i].bpcc & 0x7FU) <
                       38U); /* 0 is valid, ignore sign for check */
    }

    /* METH */
    l_is_valid &= ((jp2->meth > 0) && (jp2->meth < 3));

    /* stream validation */
    /* back and forth is needed */
    l_is_valid &= opj_stream_has_seek(cio);

    return l_is_valid;
}